

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasher.cpp
# Opt level: O0

hasher256 * __thiscall libtorrent::lcrypto::hasher256::update(hasher256 *this,span<const_char> data)

{
  EVP_MD_CTX *ctx;
  char *d;
  size_t cnt;
  hasher256 *this_local;
  span<const_char> data_local;
  
  data_local.m_ptr = (char *)data.m_len;
  this_local = (hasher256 *)data.m_ptr;
  ctx = (EVP_MD_CTX *)this->m_context;
  d = span<const_char>::data((span<const_char> *)&this_local);
  cnt = span<const_char>::size((span<const_char> *)&this_local);
  EVP_DigestUpdate(ctx,d,cnt);
  return this;
}

Assistant:

hasher256& hasher256::update(span<char const> data)
	{
		TORRENT_ASSERT(!data.empty());
#ifdef TORRENT_USE_LIBGCRYPT
		gcry_md_write(m_context, data.data(), data.size());
#elif TORRENT_USE_COMMONCRYPTO
		CC_SHA256_Update(&m_context, reinterpret_cast<unsigned char const*>(data.data()), CC_LONG(data.size()));
#elif TORRENT_USE_CNG
		m_context.update(data);
#elif TORRENT_USE_CRYPTOAPI_SHA_512
		m_context.update(data);
#elif defined TORRENT_USE_LIBCRYPTO
		EVP_DigestUpdate(m_context, reinterpret_cast<unsigned char const*>(data.data())
			, static_cast<std::size_t>(data.size()));
#else
		aux::SHA256_update(m_context, reinterpret_cast<unsigned char const*>(data.data())
			, static_cast<std::size_t>(data.size()));
#endif
		return *this;
	}